

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

bool embree::avx::
     BVHNIntersector1<8,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMvMBIntersector1Moeller<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  uint uVar3;
  uint uVar4;
  Geometry *this;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  bool bVar15;
  bool bVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  byte bVar20;
  undefined1 (*pauVar21) [16];
  ulong uVar22;
  undefined1 (*pauVar23) [16];
  undefined1 (*pauVar24) [16];
  long lVar25;
  undefined1 (*pauVar26) [16];
  uint uVar27;
  byte bVar28;
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [64];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 in_ZMM8 [64];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 in_ZMM9 [64];
  float fVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  float fVar52;
  undefined1 auVar49 [32];
  float fVar50;
  float fVar51;
  float fVar53;
  float fVar54;
  float fVar55;
  undefined1 in_ZMM10 [64];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 in_ZMM11 [64];
  float fVar58;
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  undefined1 in_ZMM12 [64];
  undefined1 auVar67 [32];
  undefined1 in_ZMM13 [64];
  undefined1 auVar68 [32];
  undefined1 auVar69 [64];
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_24c0 [16];
  undefined1 local_24a0 [8];
  float fStack_2498;
  float fStack_2494;
  float fStack_2490;
  float fStack_248c;
  float fStack_2488;
  float fStack_2484;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  float local_2420;
  float fStack_241c;
  float fStack_2418;
  float fStack_2414;
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  float fStack_2404;
  float local_2400;
  float fStack_23fc;
  float fStack_23f8;
  float fStack_23f4;
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  float fStack_23e4;
  float local_23e0;
  float fStack_23dc;
  float fStack_23d8;
  float fStack_23d4;
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  float fStack_23c4;
  float local_23c0;
  float fStack_23bc;
  float fStack_23b8;
  float fStack_23b4;
  float fStack_23b0;
  float fStack_23ac;
  float fStack_23a8;
  float fStack_23a4;
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  undefined1 auVar29 [32];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 == 8) {
    return false;
  }
  uStack_2398 = 0;
  fVar46 = *(float *)&(context->query_radius).field_0;
  auVar34 = ZEXT3264(CONCAT428(fVar46,CONCAT424(fVar46,CONCAT420(fVar46,CONCAT416(fVar46,CONCAT412(
                                                  fVar46,CONCAT48(fVar46,CONCAT44(fVar46,fVar46)))))
                                               )));
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    local_24c0 = ZEXT416((uint)(query->radius * query->radius));
  }
  else {
    aVar2 = (context->query_radius).field_0;
    local_24c0 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  }
  pauVar24 = (undefined1 (*) [16])local_2390;
  uVar1 = *(undefined4 *)&(query->p).field_0;
  local_2480._4_4_ = uVar1;
  local_2480._0_4_ = uVar1;
  local_2480._8_4_ = uVar1;
  local_2480._12_4_ = uVar1;
  local_2480._16_4_ = uVar1;
  local_2480._20_4_ = uVar1;
  local_2480._24_4_ = uVar1;
  local_2480._28_4_ = uVar1;
  auVar69 = ZEXT3264(local_2480);
  local_2400 = *(float *)((long)&(query->p).field_0 + 4);
  fStack_23fc = local_2400;
  fStack_23f8 = local_2400;
  fStack_23f4 = local_2400;
  fStack_23f0 = local_2400;
  fStack_23ec = local_2400;
  fStack_23e8 = local_2400;
  fStack_23e4 = local_2400;
  local_2420 = *(float *)((long)&(query->p).field_0 + 8);
  fStack_241c = local_2420;
  fStack_2418 = local_2420;
  fStack_2414 = local_2420;
  fStack_2410 = local_2420;
  fStack_240c = local_2420;
  fStack_2408 = local_2420;
  fStack_2404 = local_2420;
  local_23c0 = (context->query_radius).field_0.m128[1];
  fStack_23bc = local_23c0;
  fStack_23b8 = local_23c0;
  fStack_23b4 = local_23c0;
  fStack_23b0 = local_23c0;
  fStack_23ac = local_23c0;
  fStack_23a8 = local_23c0;
  fStack_23a4 = local_23c0;
  local_23e0 = (context->query_radius).field_0.m128[2];
  fStack_23dc = local_23e0;
  fStack_23d8 = local_23e0;
  fStack_23d4 = local_23e0;
  fStack_23d0 = local_23e0;
  fStack_23cc = local_23e0;
  fStack_23c8 = local_23e0;
  fStack_23c4 = local_23e0;
  auVar37 = vshufps_avx(ZEXT416((uint)(fVar46 * fVar46)),ZEXT416((uint)(fVar46 * fVar46)),0);
  auVar29._16_16_ = auVar37;
  auVar29._0_16_ = auVar37;
  bVar16 = false;
LAB_014ce993:
  auVar30 = ZEXT3264(auVar29);
  local_2460 = auVar34._0_32_;
  local_2440 = vsubps_avx(auVar69._0_32_,local_2460);
  auVar33._0_4_ = auVar69._0_4_ + auVar34._0_4_;
  auVar33._4_4_ = auVar69._4_4_ + auVar34._4_4_;
  auVar33._8_4_ = auVar69._8_4_ + auVar34._8_4_;
  auVar33._12_4_ = auVar69._12_4_ + auVar34._12_4_;
  auVar33._16_4_ = auVar69._16_4_ + auVar34._16_4_;
  auVar33._20_4_ = auVar69._20_4_ + auVar34._20_4_;
  auVar33._24_4_ = auVar69._24_4_ + auVar34._24_4_;
  auVar33._28_4_ = auVar69._28_4_ + auVar34._28_4_;
  auVar8._4_4_ = fStack_23fc;
  auVar8._0_4_ = local_2400;
  auVar8._8_4_ = fStack_23f8;
  auVar8._12_4_ = fStack_23f4;
  auVar8._16_4_ = fStack_23f0;
  auVar8._20_4_ = fStack_23ec;
  auVar8._24_4_ = fStack_23e8;
  auVar8._28_4_ = fStack_23e4;
  auVar6._4_4_ = fStack_23bc;
  auVar6._0_4_ = local_23c0;
  auVar6._8_4_ = fStack_23b8;
  auVar6._12_4_ = fStack_23b4;
  auVar6._16_4_ = fStack_23b0;
  auVar6._20_4_ = fStack_23ac;
  auVar6._24_4_ = fStack_23a8;
  auVar6._28_4_ = fStack_23a4;
  auVar8 = vsubps_avx(auVar8,auVar6);
  auVar35._0_4_ = local_2400 + local_23c0;
  auVar35._4_4_ = fStack_23fc + fStack_23bc;
  auVar35._8_4_ = fStack_23f8 + fStack_23b8;
  auVar35._12_4_ = fStack_23f4 + fStack_23b4;
  auVar35._16_4_ = fStack_23f0 + fStack_23b0;
  auVar35._20_4_ = fStack_23ec + fStack_23ac;
  auVar35._24_4_ = fStack_23e8 + fStack_23a8;
  auVar35._28_4_ = fStack_23e4 + fStack_23a4;
  auVar9._4_4_ = fStack_241c;
  auVar9._0_4_ = local_2420;
  auVar9._8_4_ = fStack_2418;
  auVar9._12_4_ = fStack_2414;
  auVar9._16_4_ = fStack_2410;
  auVar9._20_4_ = fStack_240c;
  auVar9._24_4_ = fStack_2408;
  auVar9._28_4_ = fStack_2404;
  auVar68._4_4_ = fStack_23dc;
  auVar68._0_4_ = local_23e0;
  auVar68._8_4_ = fStack_23d8;
  auVar68._12_4_ = fStack_23d4;
  auVar68._16_4_ = fStack_23d0;
  auVar68._20_4_ = fStack_23cc;
  auVar68._24_4_ = fStack_23c8;
  auVar68._28_4_ = fStack_23c4;
  auVar9 = vsubps_avx(auVar9,auVar68);
  auVar36._0_4_ = local_2420 + local_23e0;
  auVar36._4_4_ = fStack_241c + fStack_23dc;
  auVar36._8_4_ = fStack_2418 + fStack_23d8;
  auVar36._12_4_ = fStack_2414 + fStack_23d4;
  auVar36._16_4_ = fStack_2410 + fStack_23d0;
  auVar36._20_4_ = fStack_240c + fStack_23cc;
  auVar36._24_4_ = fStack_2408 + fStack_23c8;
  auVar36._28_4_ = fStack_2404 + fStack_23c4;
  while( true ) {
    pauVar21 = pauVar24 + -1;
    pauVar24 = pauVar24 + -1;
    if ((float)local_24c0._0_4_ < *(float *)(*pauVar21 + 8)) break;
    uVar18 = *(ulong *)*pauVar24;
LAB_014ce9f9:
    auVar68 = auVar69._0_32_;
    fVar46 = in_ZMM8._28_4_;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      if ((uVar18 & 8) != 0) {
LAB_014cef4e:
        uVar17 = (ulong)((uint)uVar18 & 0xf);
        if (uVar17 == 8) break;
        lVar25 = (uVar18 & 0xfffffffffffffff0) + 0x130;
        lVar19 = 0;
        bVar20 = 0;
        goto LAB_014cef77;
      }
      uVar17 = uVar18 & 0xfffffffffffffff0;
      fVar50 = query->time;
      auVar39._4_4_ = fVar50;
      auVar39._0_4_ = fVar50;
      auVar39._8_4_ = fVar50;
      auVar39._12_4_ = fVar50;
      auVar39._16_4_ = fVar50;
      auVar39._20_4_ = fVar50;
      auVar39._24_4_ = fVar50;
      auVar39._28_4_ = fVar50;
      auVar41._0_4_ = fVar50 * *(float *)(uVar17 + 0x100) + *(float *)(uVar17 + 0x40);
      auVar41._4_4_ = fVar50 * *(float *)(uVar17 + 0x104) + *(float *)(uVar17 + 0x44);
      auVar41._8_4_ = fVar50 * *(float *)(uVar17 + 0x108) + *(float *)(uVar17 + 0x48);
      auVar41._12_4_ = fVar50 * *(float *)(uVar17 + 0x10c) + *(float *)(uVar17 + 0x4c);
      auVar41._16_4_ = fVar50 * *(float *)(uVar17 + 0x110) + *(float *)(uVar17 + 0x50);
      auVar41._20_4_ = fVar50 * *(float *)(uVar17 + 0x114) + *(float *)(uVar17 + 0x54);
      auVar41._24_4_ = fVar50 * *(float *)(uVar17 + 0x118) + *(float *)(uVar17 + 0x58);
      auVar41._28_4_ = fVar46 + *(float *)(uVar17 + 0x5c);
      auVar44._0_4_ = fVar50 * *(float *)(uVar17 + 0x140) + *(float *)(uVar17 + 0x80);
      auVar44._4_4_ = fVar50 * *(float *)(uVar17 + 0x144) + *(float *)(uVar17 + 0x84);
      auVar44._8_4_ = fVar50 * *(float *)(uVar17 + 0x148) + *(float *)(uVar17 + 0x88);
      auVar44._12_4_ = fVar50 * *(float *)(uVar17 + 0x14c) + *(float *)(uVar17 + 0x8c);
      auVar44._16_4_ = fVar50 * *(float *)(uVar17 + 0x150) + *(float *)(uVar17 + 0x90);
      auVar44._20_4_ = fVar50 * *(float *)(uVar17 + 0x154) + *(float *)(uVar17 + 0x94);
      auVar44._24_4_ = fVar50 * *(float *)(uVar17 + 0x158) + *(float *)(uVar17 + 0x98);
      auVar44._28_4_ = in_ZMM9._28_4_ + *(float *)(uVar17 + 0x9c);
      auVar48._0_4_ = fVar50 * *(float *)(uVar17 + 0x180) + *(float *)(uVar17 + 0xc0);
      auVar48._4_4_ = fVar50 * *(float *)(uVar17 + 0x184) + *(float *)(uVar17 + 0xc4);
      auVar48._8_4_ = fVar50 * *(float *)(uVar17 + 0x188) + *(float *)(uVar17 + 200);
      auVar48._12_4_ = fVar50 * *(float *)(uVar17 + 0x18c) + *(float *)(uVar17 + 0xcc);
      auVar48._16_4_ = fVar50 * *(float *)(uVar17 + 400) + *(float *)(uVar17 + 0xd0);
      auVar48._20_4_ = fVar50 * *(float *)(uVar17 + 0x194) + *(float *)(uVar17 + 0xd4);
      auVar48._24_4_ = fVar50 * *(float *)(uVar17 + 0x198) + *(float *)(uVar17 + 0xd8);
      auVar48._28_4_ = in_ZMM10._28_4_ + *(float *)(uVar17 + 0xdc);
      auVar56._0_4_ = fVar50 * *(float *)(uVar17 + 0x120) + *(float *)(uVar17 + 0x60);
      auVar56._4_4_ = fVar50 * *(float *)(uVar17 + 0x124) + *(float *)(uVar17 + 100);
      auVar56._8_4_ = fVar50 * *(float *)(uVar17 + 0x128) + *(float *)(uVar17 + 0x68);
      auVar56._12_4_ = fVar50 * *(float *)(uVar17 + 300) + *(float *)(uVar17 + 0x6c);
      auVar56._16_4_ = fVar50 * *(float *)(uVar17 + 0x130) + *(float *)(uVar17 + 0x70);
      auVar56._20_4_ = fVar50 * *(float *)(uVar17 + 0x134) + *(float *)(uVar17 + 0x74);
      auVar56._24_4_ = fVar50 * *(float *)(uVar17 + 0x138) + *(float *)(uVar17 + 0x78);
      auVar56._28_4_ = in_ZMM11._28_4_ + *(float *)(uVar17 + 0x7c);
      auVar59._0_4_ = fVar50 * *(float *)(uVar17 + 0x160) + *(float *)(uVar17 + 0xa0);
      auVar59._4_4_ = fVar50 * *(float *)(uVar17 + 0x164) + *(float *)(uVar17 + 0xa4);
      auVar59._8_4_ = fVar50 * *(float *)(uVar17 + 0x168) + *(float *)(uVar17 + 0xa8);
      auVar59._12_4_ = fVar50 * *(float *)(uVar17 + 0x16c) + *(float *)(uVar17 + 0xac);
      auVar59._16_4_ = fVar50 * *(float *)(uVar17 + 0x170) + *(float *)(uVar17 + 0xb0);
      auVar59._20_4_ = fVar50 * *(float *)(uVar17 + 0x174) + *(float *)(uVar17 + 0xb4);
      auVar59._24_4_ = fVar50 * *(float *)(uVar17 + 0x178) + *(float *)(uVar17 + 0xb8);
      auVar59._28_4_ = in_ZMM12._28_4_ + *(float *)(uVar17 + 0xbc);
      auVar67._0_4_ = fVar50 * *(float *)(uVar17 + 0x1a0) + *(float *)(uVar17 + 0xe0);
      auVar67._4_4_ = fVar50 * *(float *)(uVar17 + 0x1a4) + *(float *)(uVar17 + 0xe4);
      auVar67._8_4_ = fVar50 * *(float *)(uVar17 + 0x1a8) + *(float *)(uVar17 + 0xe8);
      auVar67._12_4_ = fVar50 * *(float *)(uVar17 + 0x1ac) + *(float *)(uVar17 + 0xec);
      auVar67._16_4_ = fVar50 * *(float *)(uVar17 + 0x1b0) + *(float *)(uVar17 + 0xf0);
      auVar67._20_4_ = fVar50 * *(float *)(uVar17 + 0x1b4) + *(float *)(uVar17 + 0xf4);
      auVar67._24_4_ = fVar50 * *(float *)(uVar17 + 0x1b8) + *(float *)(uVar17 + 0xf8);
      auVar67._28_4_ = in_ZMM13._28_4_ + *(float *)(uVar17 + 0xfc);
      auVar6 = vmaxps_avx(auVar68,auVar41);
      auVar6 = vminps_avx(auVar6,auVar56);
      auVar6 = vsubps_avx(auVar6,auVar68);
      auVar13._4_4_ = fStack_23fc;
      auVar13._0_4_ = local_2400;
      auVar13._8_4_ = fStack_23f8;
      auVar13._12_4_ = fStack_23f4;
      auVar13._16_4_ = fStack_23f0;
      auVar13._20_4_ = fStack_23ec;
      auVar13._24_4_ = fStack_23e8;
      auVar13._28_4_ = fStack_23e4;
      auVar68 = vmaxps_avx(auVar13,auVar44);
      auVar68 = vminps_avx(auVar68,auVar59);
      auVar10 = vsubps_avx(auVar68,auVar13);
      auVar12._4_4_ = fStack_241c;
      auVar12._0_4_ = local_2420;
      auVar12._8_4_ = fStack_2418;
      auVar12._12_4_ = fStack_2414;
      auVar12._16_4_ = fStack_2410;
      auVar12._20_4_ = fStack_240c;
      auVar12._24_4_ = fStack_2408;
      auVar12._28_4_ = fStack_2404;
      auVar68 = vmaxps_avx(auVar12,auVar48);
      auVar68 = vminps_avx(auVar68,auVar67);
      auVar68 = vsubps_avx(auVar68,auVar12);
      fVar58 = auVar6._0_4_ * auVar6._0_4_;
      fVar61 = auVar6._4_4_ * auVar6._4_4_;
      auVar11._4_4_ = fVar61;
      auVar11._0_4_ = fVar58;
      fVar62 = auVar6._8_4_ * auVar6._8_4_;
      auVar11._8_4_ = fVar62;
      fVar63 = auVar6._12_4_ * auVar6._12_4_;
      auVar11._12_4_ = fVar63;
      fVar64 = auVar6._16_4_ * auVar6._16_4_;
      auVar11._16_4_ = fVar64;
      fVar65 = auVar6._20_4_ * auVar6._20_4_;
      auVar11._20_4_ = fVar65;
      fVar66 = auVar6._24_4_ * auVar6._24_4_;
      auVar11._24_4_ = fVar66;
      auVar11._28_4_ = auVar59._28_4_;
      fVar46 = auVar68._0_4_ * auVar68._0_4_;
      fVar50 = auVar68._4_4_ * auVar68._4_4_;
      auVar5._4_4_ = fVar50;
      auVar5._0_4_ = fVar46;
      fVar51 = auVar68._8_4_ * auVar68._8_4_;
      auVar5._8_4_ = fVar51;
      fVar52 = auVar68._12_4_ * auVar68._12_4_;
      auVar5._12_4_ = fVar52;
      fVar53 = auVar68._16_4_ * auVar68._16_4_;
      auVar5._16_4_ = fVar53;
      fVar54 = auVar68._20_4_ * auVar68._20_4_;
      auVar5._20_4_ = fVar54;
      fVar55 = auVar68._24_4_ * auVar68._24_4_;
      auVar5._24_4_ = fVar55;
      auVar5._28_4_ = auVar68._28_4_;
      local_24a0._0_4_ = fVar58 + auVar10._0_4_ * auVar10._0_4_ + fVar46;
      local_24a0._4_4_ = fVar61 + auVar10._4_4_ * auVar10._4_4_ + fVar50;
      fStack_2498 = fVar62 + auVar10._8_4_ * auVar10._8_4_ + fVar51;
      fStack_2494 = fVar63 + auVar10._12_4_ * auVar10._12_4_ + fVar52;
      fStack_2490 = fVar64 + auVar10._16_4_ * auVar10._16_4_ + fVar53;
      fStack_248c = fVar65 + auVar10._20_4_ * auVar10._20_4_ + fVar54;
      fStack_2488 = fVar66 + auVar10._24_4_ * auVar10._24_4_ + fVar55;
      fStack_2484 = auVar59._28_4_ + auVar10._28_4_ + auVar68._28_4_;
      auVar68 = vcmpps_avx(_local_24a0,auVar29,2);
      auVar6 = vcmpps_avx(auVar41,auVar56,2);
      auVar68 = vandps_avx(auVar68,auVar6);
      auVar40 = auVar68._16_16_;
      auVar37 = vpackssdw_avx(auVar68._0_16_,auVar40);
    }
    else {
      if ((uVar18 & 8) != 0) goto LAB_014cef4e;
      uVar17 = uVar18 & 0xfffffffffffffff0;
      fVar50 = query->time;
      auVar39._4_4_ = fVar50;
      auVar39._0_4_ = fVar50;
      auVar39._8_4_ = fVar50;
      auVar39._12_4_ = fVar50;
      auVar39._16_4_ = fVar50;
      auVar39._20_4_ = fVar50;
      auVar39._24_4_ = fVar50;
      auVar39._28_4_ = fVar50;
      auVar45._0_4_ = fVar50 * *(float *)(uVar17 + 0x100) + *(float *)(uVar17 + 0x40);
      auVar45._4_4_ = fVar50 * *(float *)(uVar17 + 0x104) + *(float *)(uVar17 + 0x44);
      auVar45._8_4_ = fVar50 * *(float *)(uVar17 + 0x108) + *(float *)(uVar17 + 0x48);
      auVar45._12_4_ = fVar50 * *(float *)(uVar17 + 0x10c) + *(float *)(uVar17 + 0x4c);
      auVar45._16_4_ = fVar50 * *(float *)(uVar17 + 0x110) + *(float *)(uVar17 + 0x50);
      auVar45._20_4_ = fVar50 * *(float *)(uVar17 + 0x114) + *(float *)(uVar17 + 0x54);
      auVar45._24_4_ = fVar50 * *(float *)(uVar17 + 0x118) + *(float *)(uVar17 + 0x58);
      auVar45._28_4_ = fVar46 + *(float *)(uVar17 + 0x5c);
      auVar49._0_4_ = fVar50 * *(float *)(uVar17 + 0x140) + *(float *)(uVar17 + 0x80);
      auVar49._4_4_ = fVar50 * *(float *)(uVar17 + 0x144) + *(float *)(uVar17 + 0x84);
      auVar49._8_4_ = fVar50 * *(float *)(uVar17 + 0x148) + *(float *)(uVar17 + 0x88);
      auVar49._12_4_ = fVar50 * *(float *)(uVar17 + 0x14c) + *(float *)(uVar17 + 0x8c);
      auVar49._16_4_ = fVar50 * *(float *)(uVar17 + 0x150) + *(float *)(uVar17 + 0x90);
      auVar49._20_4_ = fVar50 * *(float *)(uVar17 + 0x154) + *(float *)(uVar17 + 0x94);
      auVar49._24_4_ = fVar50 * *(float *)(uVar17 + 0x158) + *(float *)(uVar17 + 0x98);
      auVar49._28_4_ = fVar46 + *(float *)(uVar17 + 0x9c);
      auVar42._0_4_ = fVar50 * *(float *)(uVar17 + 0x180) + *(float *)(uVar17 + 0xc0);
      auVar42._4_4_ = fVar50 * *(float *)(uVar17 + 0x184) + *(float *)(uVar17 + 0xc4);
      auVar42._8_4_ = fVar50 * *(float *)(uVar17 + 0x188) + *(float *)(uVar17 + 200);
      auVar42._12_4_ = fVar50 * *(float *)(uVar17 + 0x18c) + *(float *)(uVar17 + 0xcc);
      auVar42._16_4_ = fVar50 * *(float *)(uVar17 + 400) + *(float *)(uVar17 + 0xd0);
      auVar42._20_4_ = fVar50 * *(float *)(uVar17 + 0x194) + *(float *)(uVar17 + 0xd4);
      auVar42._24_4_ = fVar50 * *(float *)(uVar17 + 0x198) + *(float *)(uVar17 + 0xd8);
      auVar42._28_4_ = fVar46 + *(float *)(uVar17 + 0xdc);
      auVar57._0_4_ = fVar50 * *(float *)(uVar17 + 0x120) + *(float *)(uVar17 + 0x60);
      auVar57._4_4_ = fVar50 * *(float *)(uVar17 + 0x124) + *(float *)(uVar17 + 100);
      auVar57._8_4_ = fVar50 * *(float *)(uVar17 + 0x128) + *(float *)(uVar17 + 0x68);
      auVar57._12_4_ = fVar50 * *(float *)(uVar17 + 300) + *(float *)(uVar17 + 0x6c);
      auVar57._16_4_ = fVar50 * *(float *)(uVar17 + 0x130) + *(float *)(uVar17 + 0x70);
      auVar57._20_4_ = fVar50 * *(float *)(uVar17 + 0x134) + *(float *)(uVar17 + 0x74);
      auVar57._24_4_ = fVar50 * *(float *)(uVar17 + 0x138) + *(float *)(uVar17 + 0x78);
      auVar57._28_4_ = in_ZMM11._28_4_ + *(float *)(uVar17 + 0x7c);
      auVar60._0_4_ = fVar50 * *(float *)(uVar17 + 0x160) + *(float *)(uVar17 + 0xa0);
      auVar60._4_4_ = fVar50 * *(float *)(uVar17 + 0x164) + *(float *)(uVar17 + 0xa4);
      auVar60._8_4_ = fVar50 * *(float *)(uVar17 + 0x168) + *(float *)(uVar17 + 0xa8);
      auVar60._12_4_ = fVar50 * *(float *)(uVar17 + 0x16c) + *(float *)(uVar17 + 0xac);
      auVar60._16_4_ = fVar50 * *(float *)(uVar17 + 0x170) + *(float *)(uVar17 + 0xb0);
      auVar60._20_4_ = fVar50 * *(float *)(uVar17 + 0x174) + *(float *)(uVar17 + 0xb4);
      auVar60._24_4_ = fVar50 * *(float *)(uVar17 + 0x178) + *(float *)(uVar17 + 0xb8);
      auVar60._28_4_ = in_ZMM12._28_4_ + *(float *)(uVar17 + 0xbc);
      auVar67._0_4_ = fVar50 * *(float *)(uVar17 + 0x1a0) + *(float *)(uVar17 + 0xe0);
      auVar67._4_4_ = fVar50 * *(float *)(uVar17 + 0x1a4) + *(float *)(uVar17 + 0xe4);
      auVar67._8_4_ = fVar50 * *(float *)(uVar17 + 0x1a8) + *(float *)(uVar17 + 0xe8);
      auVar67._12_4_ = fVar50 * *(float *)(uVar17 + 0x1ac) + *(float *)(uVar17 + 0xec);
      auVar67._16_4_ = fVar50 * *(float *)(uVar17 + 0x1b0) + *(float *)(uVar17 + 0xf0);
      auVar67._20_4_ = fVar50 * *(float *)(uVar17 + 0x1b4) + *(float *)(uVar17 + 0xf4);
      auVar67._24_4_ = fVar50 * *(float *)(uVar17 + 0x1b8) + *(float *)(uVar17 + 0xf8);
      auVar67._28_4_ = in_ZMM13._28_4_ + *(float *)(uVar17 + 0xfc);
      auVar6 = vmaxps_avx(auVar68,auVar45);
      auVar6 = vminps_avx(auVar6,auVar57);
      auVar6 = vsubps_avx(auVar6,auVar68);
      auVar14._4_4_ = fStack_23fc;
      auVar14._0_4_ = local_2400;
      auVar14._8_4_ = fStack_23f8;
      auVar14._12_4_ = fStack_23f4;
      auVar14._16_4_ = fStack_23f0;
      auVar14._20_4_ = fStack_23ec;
      auVar14._24_4_ = fStack_23e8;
      auVar14._28_4_ = fStack_23e4;
      auVar68 = vmaxps_avx(auVar14,auVar49);
      auVar68 = vminps_avx(auVar68,auVar60);
      auVar11 = vsubps_avx(auVar68,auVar14);
      auVar10._4_4_ = fStack_241c;
      auVar10._0_4_ = local_2420;
      auVar10._8_4_ = fStack_2418;
      auVar10._12_4_ = fStack_2414;
      auVar10._16_4_ = fStack_2410;
      auVar10._20_4_ = fStack_240c;
      auVar10._24_4_ = fStack_2408;
      auVar10._28_4_ = fStack_2404;
      auVar68 = vmaxps_avx(auVar10,auVar42);
      auVar68 = vminps_avx(auVar68,auVar67);
      auVar68 = vsubps_avx(auVar68,auVar10);
      auVar69 = ZEXT3264(local_2480);
      local_24a0._4_4_ =
           auVar6._4_4_ * auVar6._4_4_ + auVar11._4_4_ * auVar11._4_4_ +
           auVar68._4_4_ * auVar68._4_4_;
      local_24a0._0_4_ =
           auVar6._0_4_ * auVar6._0_4_ + auVar11._0_4_ * auVar11._0_4_ +
           auVar68._0_4_ * auVar68._0_4_;
      fStack_2498 = auVar6._8_4_ * auVar6._8_4_ + auVar11._8_4_ * auVar11._8_4_ +
                    auVar68._8_4_ * auVar68._8_4_;
      fStack_2494 = auVar6._12_4_ * auVar6._12_4_ + auVar11._12_4_ * auVar11._12_4_ +
                    auVar68._12_4_ * auVar68._12_4_;
      fStack_2490 = auVar6._16_4_ * auVar6._16_4_ + auVar11._16_4_ * auVar11._16_4_ +
                    auVar68._16_4_ * auVar68._16_4_;
      fStack_248c = auVar6._20_4_ * auVar6._20_4_ + auVar11._20_4_ * auVar11._20_4_ +
                    auVar68._20_4_ * auVar68._20_4_;
      fStack_2488 = auVar6._24_4_ * auVar6._24_4_ + auVar11._24_4_ * auVar11._24_4_ +
                    auVar68._24_4_ * auVar68._24_4_;
      fStack_2484 = auVar6._28_4_ + auVar11._28_4_ + auVar68._28_4_;
      auVar68 = vcmpps_avx(auVar45,auVar57,2);
      auVar6 = vcmpps_avx(auVar60,auVar8,5);
      auVar11 = vandps_avx(auVar68,auVar6);
      auVar68 = vcmpps_avx(auVar45,auVar33,2);
      auVar6 = vcmpps_avx(auVar49,auVar35,2);
      auVar68 = vandps_avx(auVar6,auVar68);
      auVar6 = vcmpps_avx(auVar67,auVar9,5);
      auVar5 = vandps_avx(auVar11,auVar6);
      auVar56 = vcmpps_avx(auVar57,local_2440,5);
      auVar6 = vcmpps_avx(auVar42,auVar36,2);
      auVar6 = vandps_avx(auVar6,auVar56);
      auVar68 = vandps_avx(auVar68,auVar6);
      auVar68 = vandps_avx(auVar68,auVar5);
      auVar32._8_4_ = 0xffff;
      auVar32._0_8_ = 0xffff0000ffff;
      auVar32._12_4_ = 0xffff;
      auVar32._16_4_ = 0xffff;
      auVar32._20_4_ = 0xffff;
      auVar32._24_4_ = 0xffff;
      auVar32._28_4_ = 0xffff;
      auVar68 = vandps_avx(auVar68,auVar32);
      auVar40 = auVar68._16_16_;
      auVar37 = vpackusdw_avx(auVar68._0_16_,auVar40);
    }
    in_ZMM13 = ZEXT3264(auVar67);
    in_ZMM12 = ZEXT3264(auVar11);
    in_ZMM11 = ZEXT3264(auVar56);
    in_ZMM10 = ZEXT3264(auVar5);
    if (((uint)uVar18 & 7) == 6) {
      auVar68 = vcmpps_avx(*(undefined1 (*) [32])((uVar18 & 0xfffffffffffffff0) + 0x1c0),auVar39,2);
      auVar6 = vcmpps_avx(auVar39,*(undefined1 (*) [32])((uVar18 & 0xfffffffffffffff0) + 0x1e0),1);
      auVar68 = vandps_avx(auVar68,auVar6);
      auVar40 = auVar68._16_16_;
      auVar43 = vpackssdw_avx(auVar68._0_16_,auVar40);
      auVar37 = vpand_avx(auVar37,auVar43);
    }
    in_ZMM9 = ZEXT1664(auVar40);
    in_ZMM8 = ZEXT1664(auVar37);
    auVar37 = vpsllw_avx(auVar37,0xf);
    if ((((((((auVar37 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar37 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar37 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar37 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar37 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar37 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar37 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar37[0xf] < '\0')
    {
      auVar37 = vpacksswb_avx(auVar37,auVar37);
      bVar20 = SUB161(auVar37 >> 7,0) & 1 | (SUB161(auVar37 >> 0xf,0) & 1) << 1 |
               (SUB161(auVar37 >> 0x17,0) & 1) << 2 | (SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
               (SUB161(auVar37 >> 0x27,0) & 1) << 4 | (SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
               (SUB161(auVar37 >> 0x37,0) & 1) << 6 | SUB161(auVar37 >> 0x3f,0) << 7;
      uVar17 = uVar18 & 0xfffffffffffffff0;
      lVar19 = 0;
      if (bVar20 != 0) {
        for (; (bVar20 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
        }
      }
      uVar18 = *(ulong *)(uVar17 + lVar19 * 8);
      uVar27 = bVar20 - 1 & (uint)bVar20;
      if (uVar27 != 0) {
        uVar3 = *(uint *)(local_24a0 + lVar19 * 4);
        lVar19 = 0;
        if (uVar27 != 0) {
          for (; (uVar27 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
          }
        }
        uVar22 = *(ulong *)(uVar17 + lVar19 * 8);
        uVar4 = *(uint *)(local_24a0 + lVar19 * 4);
        uVar27 = uVar27 - 1 & uVar27;
        if (uVar27 == 0) {
          if (uVar3 < uVar4) {
            *(ulong *)*pauVar24 = uVar22;
            *(uint *)(*pauVar24 + 8) = uVar4;
            pauVar24 = pauVar24 + 1;
          }
          else {
            *(ulong *)*pauVar24 = uVar18;
            *(uint *)(*pauVar24 + 8) = uVar3;
            pauVar24 = pauVar24 + 1;
            uVar18 = uVar22;
          }
        }
        else {
          auVar37._8_8_ = 0;
          auVar37._0_8_ = uVar18;
          auVar37 = vpunpcklqdq_avx(auVar37,ZEXT416(uVar3));
          auVar40._8_8_ = 0;
          auVar40._0_8_ = uVar22;
          auVar40 = vpunpcklqdq_avx(auVar40,ZEXT416(uVar4));
          lVar19 = 0;
          if (uVar27 != 0) {
            for (; (uVar27 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
            }
          }
          auVar43._8_8_ = 0;
          auVar43._0_8_ = *(ulong *)(uVar17 + lVar19 * 8);
          auVar43 = vpunpcklqdq_avx(auVar43,ZEXT416(*(uint *)(local_24a0 + lVar19 * 4)));
          in_ZMM9 = ZEXT1664(auVar43);
          uVar27 = uVar27 - 1 & uVar27;
          if (uVar27 == 0) {
            auVar47 = vpcmpgtd_avx(auVar40,auVar37);
            auVar38 = vpshufd_avx(auVar47,0xaa);
            auVar47 = vblendvps_avx(auVar40,auVar37,auVar38);
            auVar37 = vblendvps_avx(auVar37,auVar40,auVar38);
            auVar40 = vpcmpgtd_avx(auVar43,auVar47);
            auVar38 = vpshufd_avx(auVar40,0xaa);
            auVar40 = vblendvps_avx(auVar43,auVar47,auVar38);
            in_ZMM10 = ZEXT1664(auVar40);
            auVar43 = vblendvps_avx(auVar47,auVar43,auVar38);
            in_ZMM8 = ZEXT1664(auVar43);
            auVar47 = vpcmpgtd_avx(auVar43,auVar37);
            auVar38 = vpshufd_avx(auVar47,0xaa);
            in_ZMM9 = ZEXT1664(auVar38);
            auVar47 = vblendvps_avx(auVar43,auVar37,auVar38);
            in_ZMM11 = ZEXT1664(auVar47);
            auVar37 = vblendvps_avx(auVar37,auVar43,auVar38);
            *pauVar24 = auVar37;
            pauVar24[1] = auVar47;
            uVar18 = auVar40._0_8_;
            pauVar24 = pauVar24 + 2;
          }
          else {
            lVar19 = 0;
            if (uVar27 != 0) {
              for (; (uVar27 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
              }
            }
            in_ZMM11 = ZEXT464(*(uint *)(local_24a0 + lVar19 * 4));
            auVar47._8_8_ = 0;
            auVar47._0_8_ = *(ulong *)(uVar17 + lVar19 * 8);
            auVar47 = vpunpcklqdq_avx(auVar47,ZEXT416(*(uint *)(local_24a0 + lVar19 * 4)));
            in_ZMM10 = ZEXT1664(auVar47);
            uVar27 = uVar27 - 1 & uVar27;
            uVar22 = (ulong)uVar27;
            if (uVar27 == 0) {
              auVar38 = vpcmpgtd_avx(auVar40,auVar37);
              auVar7 = vpshufd_avx(auVar38,0xaa);
              auVar38 = vblendvps_avx(auVar40,auVar37,auVar7);
              auVar37 = vblendvps_avx(auVar37,auVar40,auVar7);
              auVar40 = vpcmpgtd_avx(auVar47,auVar43);
              auVar7 = vpshufd_avx(auVar40,0xaa);
              auVar40 = vblendvps_avx(auVar47,auVar43,auVar7);
              auVar43 = vblendvps_avx(auVar43,auVar47,auVar7);
              auVar47 = vpcmpgtd_avx(auVar43,auVar37);
              auVar7 = vpshufd_avx(auVar47,0xaa);
              auVar47 = vblendvps_avx(auVar43,auVar37,auVar7);
              in_ZMM10 = ZEXT1664(auVar47);
              auVar37 = vblendvps_avx(auVar37,auVar43,auVar7);
              auVar43 = vpcmpgtd_avx(auVar40,auVar38);
              auVar7 = vpshufd_avx(auVar43,0xaa);
              auVar43 = vblendvps_avx(auVar40,auVar38,auVar7);
              in_ZMM9 = ZEXT1664(auVar43);
              auVar40 = vblendvps_avx(auVar38,auVar40,auVar7);
              auVar38 = vpcmpgtd_avx(auVar47,auVar40);
              auVar7 = vpshufd_avx(auVar38,0xaa);
              in_ZMM11 = ZEXT1664(auVar7);
              auVar38 = vblendvps_avx(auVar47,auVar40,auVar7);
              in_ZMM12 = ZEXT1664(auVar38);
              auVar40 = vblendvps_avx(auVar40,auVar47,auVar7);
              in_ZMM8 = ZEXT1664(auVar40);
              *pauVar24 = auVar37;
              pauVar24[1] = auVar40;
              pauVar24[2] = auVar38;
              uVar18 = auVar43._0_8_;
              pauVar21 = pauVar24 + 3;
            }
            else {
              *pauVar24 = auVar37;
              pauVar24[1] = auVar40;
              pauVar24[2] = auVar43;
              pauVar24[3] = auVar47;
              lVar19 = 0x30;
              do {
                lVar25 = lVar19;
                lVar19 = 0;
                if (uVar22 != 0) {
                  for (; (uVar22 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
                  }
                }
                uVar18 = *(ulong *)(uVar17 + lVar19 * 8);
                in_ZMM8 = ZEXT464(*(uint *)(local_24a0 + lVar19 * 4));
                auVar38._8_8_ = 0;
                auVar38._0_8_ = uVar18;
                auVar37 = vpunpcklqdq_avx(auVar38,ZEXT416(*(uint *)(local_24a0 + lVar19 * 4)));
                *(undefined1 (*) [16])(pauVar24[1] + lVar25) = auVar37;
                uVar22 = uVar22 & uVar22 - 1;
                lVar19 = lVar25 + 0x10;
              } while (uVar22 != 0);
              pauVar21 = (undefined1 (*) [16])(pauVar24[1] + lVar25);
              if (lVar25 + 0x10 != 0) {
                lVar19 = 0x10;
                pauVar23 = pauVar24;
                do {
                  auVar37 = pauVar23[1];
                  pauVar23 = pauVar23 + 1;
                  uVar27 = vextractps_avx(auVar37,2);
                  lVar25 = lVar19;
                  do {
                    if (uVar27 <= *(uint *)(pauVar24[-1] + lVar25 + 8)) {
                      pauVar26 = (undefined1 (*) [16])(*pauVar24 + lVar25);
                      break;
                    }
                    in_ZMM8 = ZEXT1664(*(undefined1 (*) [16])(pauVar24[-1] + lVar25));
                    *(undefined1 (*) [16])(*pauVar24 + lVar25) =
                         *(undefined1 (*) [16])(pauVar24[-1] + lVar25);
                    lVar25 = lVar25 + -0x10;
                    pauVar26 = pauVar24;
                  } while (lVar25 != 0);
                  *pauVar26 = auVar37;
                  lVar19 = lVar19 + 0x10;
                } while (pauVar21 != pauVar23);
                uVar18 = *(ulong *)*pauVar21;
              }
            }
            auVar69 = ZEXT3264(local_2480);
            pauVar24 = pauVar21;
          }
        }
      }
      goto LAB_014ce9f9;
    }
    if (pauVar24 == (undefined1 (*) [16])&local_23a0) {
      return bVar16;
    }
  }
  auVar34 = ZEXT3264(local_2460);
  goto LAB_014cf07f;
LAB_014cef77:
  do {
    local_2440._0_8_ = lVar19;
    lVar19 = -0x10;
    bVar28 = 0;
    do {
      uVar27 = *(uint *)(lVar25 + lVar19);
      if ((ulong)uVar27 == 0xffffffff) break;
      this = (context->scene->geometries).items[uVar27].ptr;
      context->geomID = uVar27;
      context->primID = *(uint *)(lVar25 + 0x10 + lVar19);
      auVar30 = ZEXT1664(auVar30._0_16_);
      in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
      in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
      in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
      in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
      in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
      in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
      bVar15 = Geometry::pointQuery(this,query,context);
      auVar69 = ZEXT3264(local_2480);
      bVar28 = bVar28 | bVar15;
      lVar19 = lVar19 + 4;
    } while (lVar19 != 0);
    bVar20 = bVar20 | bVar28;
    lVar19 = local_2440._0_8_ + 1;
    lVar25 = lVar25 + 0x140;
  } while (lVar19 != uVar17 - 8);
  if (bVar20 == 0) {
    auVar34 = ZEXT3264(local_2460);
  }
  else {
    uVar1 = *(undefined4 *)&(context->query_radius).field_0;
    auVar34 = ZEXT3264(CONCAT428(uVar1,CONCAT424(uVar1,CONCAT420(uVar1,CONCAT416(uVar1,CONCAT412(
                                                  uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))))))));
    local_23c0 = (context->query_radius).field_0.m128[1];
    fStack_23bc = local_23c0;
    fStack_23b8 = local_23c0;
    fStack_23b4 = local_23c0;
    fStack_23b0 = local_23c0;
    fStack_23ac = local_23c0;
    fStack_23a8 = local_23c0;
    fStack_23a4 = local_23c0;
    local_23e0 = (context->query_radius).field_0.m128[2];
    fStack_23dc = local_23e0;
    fStack_23d8 = local_23e0;
    fStack_23d4 = local_23e0;
    fStack_23d0 = local_23e0;
    fStack_23cc = local_23e0;
    fStack_23c8 = local_23e0;
    fStack_23c4 = local_23e0;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      auVar30 = ZEXT464((uint)(query->radius * query->radius));
    }
    else {
      aVar2 = (context->query_radius).field_0;
      auVar37 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
      auVar30 = ZEXT1664(auVar37);
    }
    local_24c0 = auVar30._0_16_;
    bVar16 = true;
  }
LAB_014cf07f:
  auVar31._0_4_ = auVar34._0_4_ * auVar34._0_4_;
  auVar31._4_4_ = auVar34._4_4_ * auVar34._4_4_;
  auVar31._8_4_ = auVar34._8_4_ * auVar34._8_4_;
  auVar31._12_4_ = auVar34._12_4_ * auVar34._12_4_;
  auVar31._16_4_ = auVar34._16_4_ * auVar34._16_4_;
  auVar31._20_4_ = auVar34._20_4_ * auVar34._20_4_;
  auVar31._28_36_ = auVar30._28_36_;
  auVar31._24_4_ = auVar34._24_4_ * auVar34._24_4_;
  auVar29 = auVar31._0_32_;
  if (pauVar24 == (undefined1 (*) [16])&local_23a0) {
    return bVar16;
  }
  goto LAB_014ce993;
}

Assistant:

bool BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::pointQuery(
      const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
    {
      return PointQueryDispatch<N, types, robust, PrimitiveIntersector1>::pointQuery(This, query, context);
    }